

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rand.cpp
# Opt level: O1

int __thiscall crnlib::random::irand_inclusive(random *this,int l,int h)

{
  uint32 uVar1;
  
  if (l <= h) {
    uVar1 = urand32(this);
    l = (int)((ulong)uVar1 * (ulong)((h - l) + 1) >> 0x20) + l;
  }
  return l;
}

Assistant:

int random::irand_inclusive(int l, int h)
    {
        CRNLIB_ASSERT(h < cINT32_MAX);
        return irand(l, h + 1);
    }